

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.h
# Opt level: O1

ptime booster::ptime::from_number(double d)

{
  double dVar1;
  double dVar2;
  ptime pVar3;
  ptime local_20;
  
  dVar1 = floor(d);
  dVar2 = floor((d - dVar1) * 1000000000.0);
  local_20.nsec = 0;
  if (0 < (int)dVar2) {
    local_20.nsec = (int)dVar2;
  }
  if (0x3b9ac9fe < local_20.nsec) {
    local_20.nsec = 999999999;
  }
  local_20.sec = (long)dVar1;
  normalize(&local_20);
  pVar3.nsec = local_20.nsec;
  pVar3.sec = local_20.sec;
  pVar3._12_4_ = 0;
  return pVar3;
}

Assistant:

static ptime from_number(double d)
		{
			double sec = floor(d);
			double subsec = d-sec;
			long long seconds = static_cast<long long>(sec);
			int nano = static_cast<int>(floor(subsec * 1e9));
			if(nano < 0) nano = 0;
			if(nano >= one_e9) nano = one_e9-1;
			return ptime(seconds,nano);
		}